

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plaRead.c
# Opt level: O3

Vec_Str_t * Pla_ReadPlaBody(char *pBuffer,char *pLimit,Pla_File_t Type)

{
  size_t sVar1;
  char cVar2;
  Vec_Str_t *pVVar3;
  char *pcVar4;
  uint uVar5;
  
  pVVar3 = (Vec_Str_t *)malloc(0x10);
  pVVar3->nCap = 10000;
  pVVar3->nSize = 0;
  pcVar4 = (char *)malloc(10000);
  pVVar3->pArray = pcVar4;
  if (pBuffer < pLimit) {
    do {
      cVar2 = *pBuffer;
      if (cVar2 == '.') {
        cVar2 = '.';
        while ((cVar2 != '\0' && (cVar2 != '\n'))) {
          pcVar4 = pBuffer + 1;
          pBuffer = pBuffer + 1;
          cVar2 = *pcVar4;
        }
      }
      switch(cVar2) {
      case '-':
      case '2':
switchD_0035f3cb_caseD_2d:
        uVar5 = pVVar3->nSize;
        if (uVar5 == pVVar3->nCap) {
          if ((int)uVar5 < 0x10) {
            if (pVVar3->pArray == (char *)0x0) {
              pcVar4 = (char *)malloc(0x10);
            }
            else {
              pcVar4 = (char *)realloc(pVVar3->pArray,0x10);
            }
            pVVar3->pArray = pcVar4;
            pVVar3->nCap = 0x10;
          }
          else {
            sVar1 = (ulong)uVar5 * 2;
            if (pVVar3->pArray == (char *)0x0) {
              pcVar4 = (char *)malloc(sVar1);
            }
            else {
              pcVar4 = (char *)realloc(pVVar3->pArray,sVar1);
            }
            pVVar3->pArray = pcVar4;
            pVVar3->nCap = (int)sVar1;
          }
        }
        else {
          pcVar4 = pVVar3->pArray;
        }
        cVar2 = '\0';
        break;
      case '.':
      case '/':
        goto switchD_0035f3cb_caseD_2e;
      case '0':
switchD_0035f3cb_caseD_30:
        uVar5 = pVVar3->nSize;
        if (uVar5 == pVVar3->nCap) {
          if ((int)uVar5 < 0x10) {
            if (pVVar3->pArray == (char *)0x0) {
              pcVar4 = (char *)malloc(0x10);
            }
            else {
              pcVar4 = (char *)realloc(pVVar3->pArray,0x10);
            }
            pVVar3->pArray = pcVar4;
            pVVar3->nCap = 0x10;
          }
          else {
            sVar1 = (ulong)uVar5 * 2;
            if (pVVar3->pArray == (char *)0x0) {
              pcVar4 = (char *)malloc(sVar1);
            }
            else {
              pcVar4 = (char *)realloc(pVVar3->pArray,sVar1);
            }
            pVVar3->pArray = pcVar4;
            pVVar3->nCap = (int)sVar1;
          }
        }
        else {
          pcVar4 = pVVar3->pArray;
        }
        cVar2 = '\x01';
        break;
      case '1':
        uVar5 = pVVar3->nSize;
        if (uVar5 == pVVar3->nCap) {
          if ((int)uVar5 < 0x10) {
            if (pVVar3->pArray == (char *)0x0) {
              pcVar4 = (char *)malloc(0x10);
            }
            else {
              pcVar4 = (char *)realloc(pVVar3->pArray,0x10);
            }
            pVVar3->pArray = pcVar4;
            pVVar3->nCap = 0x10;
          }
          else {
            sVar1 = (ulong)uVar5 * 2;
            if (pVVar3->pArray == (char *)0x0) {
              pcVar4 = (char *)malloc(sVar1);
            }
            else {
              pcVar4 = (char *)realloc(pVVar3->pArray,sVar1);
            }
            pVVar3->pArray = pcVar4;
            pVVar3->nCap = (int)sVar1;
          }
        }
        else {
          pcVar4 = pVVar3->pArray;
        }
        cVar2 = '\x02';
        break;
      default:
        if (cVar2 == '~') {
          if (Type < PLA_FILE_FR) goto switchD_0035f3cb_caseD_30;
          if (Type != PLA_FILE_FDR) {
            if (Type != PLA_FILE_FR) {
              __assert_fail("0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/pla/plaRead.c"
                            ,0x98,"Vec_Str_t *Pla_ReadPlaBody(char *, char *, Pla_File_t)");
            }
            goto switchD_0035f3cb_caseD_2d;
          }
          uVar5 = pVVar3->nSize;
          if (uVar5 == pVVar3->nCap) {
            if ((int)uVar5 < 0x10) {
              if (pVVar3->pArray == (char *)0x0) {
                pcVar4 = (char *)malloc(0x10);
              }
              else {
                pcVar4 = (char *)realloc(pVVar3->pArray,0x10);
              }
              pVVar3->pArray = pcVar4;
              pVVar3->nCap = 0x10;
            }
            else {
              sVar1 = (ulong)uVar5 * 2;
              if (pVVar3->pArray == (char *)0x0) {
                pcVar4 = (char *)malloc(sVar1);
              }
              else {
                pcVar4 = (char *)realloc(pVVar3->pArray,sVar1);
              }
              pVVar3->pArray = pcVar4;
              pVVar3->nCap = (int)sVar1;
            }
          }
          else {
            pcVar4 = pVVar3->pArray;
          }
          cVar2 = '\x03';
          break;
        }
        goto switchD_0035f3cb_caseD_2e;
      }
      pVVar3->nSize = uVar5 + 1;
      pcVar4[(int)uVar5] = cVar2;
switchD_0035f3cb_caseD_2e:
      pBuffer = pBuffer + 1;
    } while (pBuffer < pLimit);
  }
  return pVVar3;
}

Assistant:

Vec_Str_t * Pla_ReadPlaBody( char * pBuffer, char * pLimit, Pla_File_t Type )
{
    char * pTemp;
    Vec_Str_t * vLits;
    vLits = Vec_StrAlloc( 10000 );
    for ( pTemp = pBuffer; pTemp < pLimit; pTemp++ )
    {
        if ( *pTemp == '.' )
            while ( *pTemp && *pTemp != '\n' )
                pTemp++;
        if ( *pTemp == '0' )
            Vec_StrPush( vLits, (char)PLA_LIT_ZERO );
        else if ( *pTemp == '1' )
            Vec_StrPush( vLits, (char)PLA_LIT_ONE );
        else if ( *pTemp == '-' || *pTemp == '2' )
            Vec_StrPush( vLits, (char)PLA_LIT_DASH );
        else if ( *pTemp == '~' ) // no meaning
        {
            if ( Type == PLA_FILE_F || Type == PLA_FILE_FD )
                Vec_StrPush( vLits, (char)PLA_LIT_ZERO );
            else if ( Type == PLA_FILE_FR )
                Vec_StrPush( vLits, (char)PLA_LIT_DASH );
            else if ( Type == PLA_FILE_FDR )
                Vec_StrPush( vLits, (char)PLA_LIT_FULL );
            else assert( 0 );
        }
    }
    return vLits;
}